

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O0

void __thiscall dg::pta::PSEquivalentNodesMerger::mergeCasts(PSEquivalentNodesMerger *this)

{
  bool bVar1;
  PSNodeType PVar2;
  pointer this_00;
  size_t sVar3;
  PSNode *in_RDI;
  PSNodeGep *GEP;
  PSNode *node;
  unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *nodeptr;
  const_iterator __end2;
  const_iterator __begin2;
  NodesT *__range2;
  pointer in_stack_ffffffffffffffa8;
  PSNode *in_stack_ffffffffffffffb0;
  Offset in_stack_ffffffffffffffc0;
  PSNode *in_stack_ffffffffffffffc8;
  __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
  local_18;
  NodesT *local_10;
  
  local_10 = PointerGraph::getNodes((PointerGraph *)in_RDI->_vptr_PSNode);
  local_18._M_current =
       (unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
       std::
       vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
       ::begin((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
                *)in_stack_ffffffffffffffa8);
  std::
  vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
  ::end((vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>
         *)in_stack_ffffffffffffffa8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
                             *)in_stack_ffffffffffffffb0,
                            (__normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
                             *)in_stack_ffffffffffffffa8), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
    ::operator*(&local_18);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                       0x15d32f);
    if (bVar1) {
      this_00 = std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>::get
                          ((unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_> *)
                           0x15d342);
      PVar2 = PSNode::getType(this_00);
      if ((PVar2 == CAST) ||
         (((PVar2 = PSNode::getType(this_00), PVar2 == PHI &&
           (sVar3 = SubgraphNode<dg::pta::PSNode>::getOperandsNum
                              ((SubgraphNode<dg::pta::PSNode> *)0x15d373), sVar3 != 0)) &&
          (bVar1 = allOperandsAreSame(in_stack_ffffffffffffffc8), bVar1)))) {
        SubgraphNode<dg::pta::PSNode>::getOperand
                  ((SubgraphNode<dg::pta::PSNode> *)this_00,(size_t)in_stack_ffffffffffffffa8);
        merge((PSEquivalentNodesMerger *)in_stack_ffffffffffffffc0.offset,in_RDI,this_00);
        in_stack_ffffffffffffffb0 = this_00;
      }
      else {
        in_stack_ffffffffffffffc8 = (PSNode *)PSNodeGep::get(in_stack_ffffffffffffffb0);
        if (in_stack_ffffffffffffffc8 != (PSNode *)0x0) {
          in_stack_ffffffffffffffc0 = PSNodeGep::getOffset((PSNodeGep *)in_stack_ffffffffffffffc8);
          bVar1 = Offset::isZero((Offset *)&stack0xffffffffffffffc0);
          if (bVar1) {
            PSNodeGep::getSource((PSNodeGep *)0x15d402);
            merge((PSEquivalentNodesMerger *)in_stack_ffffffffffffffc0.offset,in_RDI,
                  in_stack_ffffffffffffffb0);
            in_stack_ffffffffffffffa8 = this_00;
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_*,_std::vector<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>,_std::allocator<std::unique_ptr<dg::pta::PSNode,_std::default_delete<dg::pta::PSNode>_>_>_>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void PSEquivalentNodesMerger::mergeCasts() {
    for (const auto &nodeptr : G->getNodes()) {
        if (!nodeptr)
            continue;

        PSNode *node = nodeptr.get();

        // cast is always 'a proxy' to the real value,
        // it does not change the pointers
        if (node->getType() == PSNodeType::CAST ||
            (node->getType() == PSNodeType::PHI && node->getOperandsNum() > 0 &&
             allOperandsAreSame(node))) {
            merge(node, node->getOperand(0));
        } else if (PSNodeGep *GEP = PSNodeGep::get(node)) {
            if (GEP->getOffset().isZero()) // GEP with 0 offest is cast
                merge(node, GEP->getSource());
        }
    }
}